

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell::
~TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell *this_local;
  
  ~TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeakReverseOrder)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 12);
    detector->deallocMemory(defaultNewAllocator(), mem2);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(!output.contains("size: 12"));
    CHECK(output.contains("size: 4"));
    PlatformSpecificFree(mem);
}